

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBooleanResult::IfcBooleanResult(IfcBooleanResult *this,void **vtt)

{
  void **vtt_local;
  IfcBooleanResult *this_local;
  
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBooleanResult,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBooleanResult,_3UL> *)
             &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             vtt + 10);
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0xd];
  *(void **)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0xe];
  std::__cxx11::string::string((string *)&(this->super_IfcGeometricRepresentationItem).field_0x30);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->FirstOperand);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->SecondOperand);
  return;
}

Assistant:

IfcBooleanResult() : Object("IfcBooleanResult") {}